

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Errors.h
# Opt level: O0

CompileMessage *
soul::CompileMessageHelpers::createMessage<>
          (CompileMessage *__return_storage_ptr__,Category category,Type type,char *text)

{
  CodeLocation local_38;
  char *local_20;
  char *text_local;
  Type type_local;
  Category category_local;
  
  local_38.sourceCode.object = (SourceCodeText *)0x0;
  local_38.location.data = (char *)0x0;
  local_20 = text;
  text_local._0_4_ = type;
  text_local._4_4_ = category;
  _type_local = __return_storage_ptr__;
  CodeLocation::CodeLocation(&local_38);
  createMessage<>(__return_storage_ptr__,category,&local_38,(Type)text_local,local_20);
  CodeLocation::~CodeLocation(&local_38);
  return __return_storage_ptr__;
}

Assistant:

static CompileMessage createMessage (CompileMessage::Category category, CompileMessage::Type type,
                                         const char* text, Args&&... args)
    {
        return createMessage (category, CodeLocation(), type, text, std::forward<Args> (args)...);
    }